

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EntityMarking::EntityMarking
          (EntityMarking *this,EntityMarkingCharacterSet MarkingCharSet,KCHAR8 *MarkingText,
          KUINT16 TextSize)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityMarking_00217c18;
  this->m_ui8EntityMarkingCharacterSet = (KUINT8)MarkingCharSet;
  if (TextSize < 0xc) {
    this->m_sEntityMarkingString[8] = '\0';
    this->m_sEntityMarkingString[9] = '\0';
    this->m_sEntityMarkingString[10] = '\0';
    this->m_sEntityMarkingString[0xb] = '\0';
    this->m_sEntityMarkingString[0] = '\0';
    this->m_sEntityMarkingString[1] = '\0';
    this->m_sEntityMarkingString[2] = '\0';
    this->m_sEntityMarkingString[3] = '\0';
    this->m_sEntityMarkingString[4] = '\0';
    this->m_sEntityMarkingString[5] = '\0';
    this->m_sEntityMarkingString[6] = '\0';
    this->m_sEntityMarkingString[7] = '\0';
    SetEntityMarkingString(this,MarkingText,TextSize);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EntityMarking",&local_41);
  KException::KException(this_00,&local_40,3);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

EntityMarking::EntityMarking(EntityMarkingCharacterSet MarkingCharSet, const KCHAR8 *MarkingText,
                             KUINT16 TextSize) noexcept(false) :
    m_ui8EntityMarkingCharacterSet( MarkingCharSet )
{
    if( TextSize > 11 )throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

    memset( m_sEntityMarkingString, 0x00, sizeof( m_sEntityMarkingString ) );
    SetEntityMarkingString( MarkingText, TextSize );
}